

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O0

int oonf_packet_apply_managed(oonf_packet_managed *managed,oonf_packet_managed_config *config)

{
  int iVar1;
  bool bVar2;
  char *local_68;
  int result;
  _Bool if_changed;
  oonf_packet_managed_config *config_local;
  oonf_packet_managed *managed_local;
  
  iVar1 = strcmp(config->interface,(managed->_managed_config).interface);
  bVar2 = true;
  if (iVar1 == 0) {
    bVar2 = false;
    if ((managed->_if_listener)._node.next != (list_entity *)0x0) {
      bVar2 = (managed->_if_listener)._node.prev != (list_entity *)0x0;
    }
    bVar2 = (bool)(bVar2 ^ 1);
  }
  oonf_packet_copy_managed_config(&managed->_managed_config,config);
  if (bVar2) {
    os_interface_linux_remove(&managed->_if_listener);
    (managed->_if_listener).mesh = (_Bool)((managed->_managed_config).mesh & 1);
    os_interface_linux_add(&managed->_if_listener);
  }
  if (((&log_global_mask)[_oonf_packet_socket_subsystem.logging] & 1) != 0) {
    if (config->interface[0] == '\0') {
      local_68 = "any";
    }
    else {
      local_68 = config->interface;
    }
    oonf_log(1,_oonf_packet_socket_subsystem.logging,"src/base/oonf_packet_socket.c",0x140,0,0,
             "Apply changes for managed socket (if %s) with port %d/%d",local_68,config->port,
             config->multicast_port);
  }
  iVar1 = _apply_managed(managed);
  if (iVar1 != 0) {
    os_interface_linux_trigger_handler(&managed->_if_listener);
  }
  return iVar1;
}

Assistant:

int
oonf_packet_apply_managed(struct oonf_packet_managed *managed, const struct oonf_packet_managed_config *config) {
  bool if_changed;
  int result;

  if_changed = strcmp(config->interface, managed->_managed_config.interface) != 0 ||
               !list_is_node_added(&managed->_if_listener._node);

  oonf_packet_copy_managed_config(&managed->_managed_config, config);

  /* handle change in interface listener */
  if (if_changed) {
    /* interface changed, remove old listener if necessary */
    os_interface_remove(&managed->_if_listener);

    /* create new interface listener */
    managed->_if_listener.mesh = managed->_managed_config.mesh;
    os_interface_add(&managed->_if_listener);
  }

  OONF_DEBUG(LOG_PACKET, "Apply changes for managed socket (if %s) with port %d/%d",
    config->interface[0] == 0 ? "any" : config->interface, config->port, config->multicast_port);

  result = _apply_managed(managed);
  if (result) {
    /* did not work, trigger interface handler to try later again */
    os_interface_trigger_handler(&managed->_if_listener);
  }
  return result;
}